

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperiodicity_extraction_by_world.cc
# Opt level: O0

void __thiscall
sptk::AperiodicityExtractionByWorld::AperiodicityExtractionByWorld
          (AperiodicityExtractionByWorld *this,int fft_length,int frame_shift,double sampling_rate)

{
  bool bVar1;
  undefined4 in_EDX;
  int in_ESI;
  AperiodicityExtractionInterface *in_RDI;
  _func_int **in_XMM0_Qa;
  
  AperiodicityExtractionInterface::AperiodicityExtractionInterface(in_RDI);
  in_RDI->_vptr_AperiodicityExtractionInterface =
       (_func_int **)&PTR__AperiodicityExtractionByWorld_00147ca8;
  *(int *)&in_RDI[1]._vptr_AperiodicityExtractionInterface = in_ESI;
  *(undefined4 *)((long)&in_RDI[1]._vptr_AperiodicityExtractionInterface + 4) = in_EDX;
  in_RDI[2]._vptr_AperiodicityExtractionInterface = in_XMM0_Qa;
  *(undefined1 *)&in_RDI[3]._vptr_AperiodicityExtractionInterface = 1;
  if (((in_ESI < 1) || (*(int *)((long)&in_RDI[1]._vptr_AperiodicityExtractionInterface + 4) < 1))
     || (bVar1 = IsInRange((double)in_RDI[2]._vptr_AperiodicityExtractionInterface,8000.0,98000.0),
        !bVar1)) {
    *(undefined1 *)&in_RDI[3]._vptr_AperiodicityExtractionInterface = 0;
  }
  return;
}

Assistant:

AperiodicityExtractionByWorld::AperiodicityExtractionByWorld(
    int fft_length, int frame_shift, double sampling_rate)
    : fft_length_(fft_length),
      frame_shift_(frame_shift),
      sampling_rate_(sampling_rate),
      is_valid_(true) {
  if (fft_length <= 0 || frame_shift_ <= 0 ||
      !sptk::IsInRange(sampling_rate_, 8000.0, 98000.0)) {
    is_valid_ = false;
    return;
  }
}